

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::add_a_l(CPU *this)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  Registers *pRVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  
  pRVar4 = this->regs;
  bVar2 = pRVar4->l;
  bVar3 = pRVar4->a;
  uVar5 = (0xf < (bVar2 & 0xf) + (bVar3 & 0xf)) * ' ';
  uVar6 = uVar5 + '\x10';
  if ((uint)bVar3 + (uint)bVar2 < 0x100) {
    uVar6 = uVar5;
  }
  pRVar4->f = uVar6;
  pRVar4->a = bVar3 + bVar2;
  if ((byte)(bVar3 + bVar2) == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 1;
}

Assistant:

int CPU::add_a_l() {
    add_r8_r8(regs.a, regs.l);
    return 1;
}